

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

Vec_Ptr_t * Gia_ManTerTranspose(Gia_ManTer_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  uint *pInfo;
  uint *pInfo_00;
  int local_30;
  int nFlopWords;
  int k;
  int i;
  uint *pFlop;
  uint *pState;
  Vec_Ptr_t *vFlops;
  Gia_ManTer_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  iVar1 = Vec_PtrSize(p->vStates);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  for (nFlopWords = 0; iVar2 = Gia_ManRegNum(p->pAig), nFlopWords < iVar2;
      nFlopWords = nFlopWords + 1) {
    iVar2 = p->pCount0[nFlopWords];
    iVar3 = Vec_PtrSize(p->vStates);
    if ((iVar2 != iVar3) && (p->pCountX[nFlopWords] < 1)) {
      pInfo = Gia_ManTerStateAlloc(iVar1);
      Vec_PtrPush(p_00,pInfo);
      for (local_30 = 0; iVar2 = Vec_PtrSize(p->vStates), local_30 < iVar2; local_30 = local_30 + 1)
      {
        pInfo_00 = (uint *)Vec_PtrEntry(p->vStates,local_30);
        iVar2 = Gia_ManTerSimInfoGet(pInfo_00,nFlopWords);
        Gia_ManTerSimInfoSet(pInfo,local_30,iVar2);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Gia_ManTerTranspose( Gia_ManTer_t * p )
{
    Vec_Ptr_t * vFlops;
    unsigned * pState, * pFlop;
    int i, k, nFlopWords;
    vFlops = Vec_PtrAlloc( 100 );
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) ) 
            continue;
        if ( p->pCountX[i] > 0 )
            continue;
        pFlop = Gia_ManTerStateAlloc( nFlopWords );
        Vec_PtrPush( vFlops, pFlop );
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
            Gia_ManTerSimInfoSet( pFlop, k, Gia_ManTerSimInfoGet(pState, i) );
//Gia_ManTerStatePrint( pFlop, Vec_PtrSize(p->vStates), i );
    }
    return vFlops;
}